

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::add_piece_async
          (torrent *this,piece_index_t piece,vector<char,_std::allocator<char>_> *data,
          add_piece_flags_t flags)

{
  piece_index_t piece_00;
  bool bVar1;
  int iVar2;
  torrent_info *this_00;
  size_type sVar3;
  element_type *this_01;
  char *data_00;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_24;
  vector<char,_std::allocator<char>_> *local_20;
  vector<char,_std::allocator<char>_> *data_local;
  torrent *this_local;
  add_piece_flags_t flags_local;
  piece_index_t piece_local;
  
  local_20 = data;
  data_local = (vector<char,_std::allocator<char>_> *)this;
  this_local._3_1_ = flags.m_val;
  this_local._4_4_ = piece.m_val;
  this_00 = torrent_file(this);
  local_24.m_val = (int)torrent_info::end_piece(this_00);
  bVar1 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator>=
                    ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                     ((long)&this_local + 4),&local_24);
  if (!bVar1) {
    sVar3 = ::std::vector<char,_std::allocator<char>_>::size(data);
    this_01 = ::std::
              __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&(this->super_torrent_hot_members).m_torrent_file);
    iVar2 = torrent_info::piece_size(this_01,this_local._4_4_);
    piece_00.m_val = this_local._4_4_;
    if (sVar3 == (long)iVar2) {
      data_00 = ::std::vector<char,_std::allocator<char>_>::data(data);
      add_piece(this,piece_00,data_00,this_local._3_1_);
    }
  }
  return;
}

Assistant:

void torrent::add_piece_async(piece_index_t const piece
		, std::vector<char> data, add_piece_flags_t const flags)
	{
		TORRENT_ASSERT(is_single_thread());

		// make sure the piece index is correct
		if (piece >= torrent_file().end_piece())
			return;

		// make sure the piece size is correct
		if (data.size() != std::size_t(m_torrent_file->piece_size(piece)))
			return;

		add_piece(piece, data.data(), flags);
	}